

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void BailOutRecord::ScheduleFunctionCodeGen
               (ScriptFunction *function,ScriptFunction *innerMostInlinee,
               BailOutRecord *bailOutRecord,BailOutKind bailOutKind,uint32 actualBailOutOffset,
               ImplicitCallFlags savedImplicitCallFlags,void *returnAddress)

{
  undefined1 *puVar1;
  uint *puVar2;
  ushort uVar3;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar4;
  FunctionEntryPointInfo *pFVar5;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  code *pcVar6;
  RejitReason RVar7;
  bool bVar8;
  byte bVar9;
  ExecutionMode EVar10;
  ImplicitCallFlags IVar11;
  BYTE BVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  LocalFunctionId functionId;
  uint32 uVar16;
  FunctionBody *pFVar17;
  undefined4 *puVar18;
  ScriptContext *pSVar19;
  FunctionEntryPointInfo *pFVar20;
  long lVar21;
  RecyclableData *pRVar22;
  Type *pTVar23;
  ScriptContext *pSVar24;
  undefined4 extraout_var_01;
  char *pcVar25;
  char *pcVar26;
  JavascriptMethod entryPoint;
  undefined4 extraout_var_02;
  char16 *pcVar27;
  undefined7 uVar29;
  undefined7 extraout_var;
  DynamicProfileInfo *pDVar28;
  undefined7 extraout_var_00;
  ulong uVar30;
  char16_t *pcVar31;
  long lVar32;
  RejitReason reason;
  BailOutRecord *this_00;
  BailOutKind local_d8 [2];
  char16 debugStringBuffer [42];
  BailOutKind local_6c;
  Type local_68;
  uint local_64;
  ScriptFunction *local_60;
  BailOutRecord *local_58;
  byte local_49;
  FunctionBody *pFStack_48;
  uint8 callsCount;
  DynamicProfileInfo *local_40;
  undefined4 local_34;
  ulong uVar33;
  
  if (bailOutKind == BailOnSimpleJitToFullJitLoopBody) {
    return;
  }
  if (bailOutKind == BailOutForGeneratorYield) {
    return;
  }
  local_68 = actualBailOutOffset;
  local_60 = function;
  pFVar17 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar17);
  local_58 = bailOutRecord;
  pFStack_48 = pFVar17;
  if ((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar18 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar8) goto LAB_00402859;
    *puVar18 = 0;
  }
  pFVar17 = pFStack_48;
  this_00 = local_58;
  bVar8 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ReJITPhase,uVar13,
                     ((pFStack_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
                     )->functionId);
  if (bVar8) {
    return;
  }
  pSVar19 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar17);
  pSVar19->firstInterpreterFrameReturnAddress = returnAddress;
  this_00->bailOutCount = this_00->bailOutCount + 1;
  pFVar20 = GetFunctionEntryPointInfo(this_00);
  pSVar4 = (pFVar17->entryPoints).ptr;
  if ((pSVar4 == (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                  *)0x0) ||
     (lVar21 = (long)(pSVar4->
                     super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     ).
                     super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                     .count, lVar21 < 1)) {
LAB_00401ae6:
    pRVar22 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                        (&((((((local_60->super_ScriptFunctionBase).super_JavascriptFunction.
                               super_DynamicObject.super_RecyclableObject.type.ptr)->
                             javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
                          )->threadContext->recyclableData);
    pTVar23 = &pRVar22->oldEntryPointInfo;
    do {
      pFVar5 = pTVar23->ptr;
      if (pFVar5 == pFVar20) break;
      pTVar23 = &pFVar5->nextEntryPoint;
    } while (pFVar5 != (FunctionEntryPointInfo *)0x0);
    this_00 = local_58;
    if (pFVar5 == (FunctionEntryPointInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar18 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x752,"(foundEntryPoint)","foundEntryPoint");
      if (!bVar8) goto LAB_00402859;
      *puVar18 = 0;
      this_00 = local_58;
    }
  }
  else {
    bVar8 = false;
    lVar32 = 0;
    do {
      pFVar5 = (FunctionEntryPointInfo *)
               (((pSVar4->
                 super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ).
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                 .buffer.ptr[lVar32].ptr)->super_RecyclerWeakReferenceBase).strongRef;
      if ((pFVar5 != (FunctionEntryPointInfo *)0x0) && (bVar8 = pFVar20 == pFVar5, bVar8)) break;
      lVar32 = lVar32 + 1;
    } while (lVar21 != lVar32);
    if (!bVar8) goto LAB_00401ae6;
  }
  uVar15 = 0xff;
  if (pFVar20->callsCount < 0xff) {
    uVar15 = pFVar20->callsCount;
  }
  local_49 = (byte)uVar15 - (DAT_015c794c + 1U);
  if ((byte)uVar15 < (byte)(DAT_015c794c + 1U)) {
    local_49 = 0;
  }
  CheckPreemptiveRejit(pFStack_48,bailOutKind,this_00,&local_49,-1);
  local_64 = (uint)local_49;
  pFVar20->callsCount = local_64;
  if (bailOutKind == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar18 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x75f,"(bailOutKind != IR::BailOutInvalid)",
                       "bailOutKind != IR::BailOutInvalid");
    if (!bVar8) goto LAB_00402859;
    *puVar18 = 0;
  }
  if ((pFStack_48->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
    local_40 = (DynamicProfileInfo *)0x0;
  }
  else {
    local_40 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFStack_48);
  }
  if (local_40 == (DynamicProfileInfo *)0x0 || (char)local_64 != '\0') {
    uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFStack_48);
    if ((pFStack_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar18 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_00402859;
      *puVar18 = 0;
    }
    bVar8 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b0240,ReJITPhase,uVar13,
                       ((pFStack_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                       ptr)->functionId);
    local_34 = 0;
    bVar9 = 0;
    if (bVar8) goto LAB_00401d05;
    goto LAB_00401dff;
  }
LAB_00401d05:
  if (((bailOutKind & (BailOutOnDivSrcConditions|BailOutOnResultConditions)) != BailOutInvalid) ||
     ((bailOutKind < BailOnSimpleJitToFullJitLoopBody &&
      ((0xc0000002U >> (bailOutKind & BailOnDivResultNotInt) & 1) != 0)))) {
    if ((bailOutKind >> 0xb & 1) == 0) {
      uVar15 = *(uint *)&local_40->bits;
      pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
      if (bailOutKind == BailOnDivResultNotInt ||
          (bailOutKind & BailOutOnDivSrcConditions) != BailOutInvalid) {
        if ((uVar15 & 0x10) != 0) {
LAB_00401d7f:
          local_34 = (undefined4)CONCAT71((int7)((ulong)pDVar28 >> 8),1);
          bVar9 = 0;
          goto switchD_004022f9_caseD_c;
        }
        *(uint *)&local_40->bits = uVar15 | 0x30;
        bVar9 = 5;
      }
      else {
        if ((uVar15 & 1) != 0) goto LAB_00401d7f;
        *(uint *)&local_40->bits = uVar15 | 3;
        bVar9 = 3;
      }
    }
    else {
      uVar15 = *(uint *)&local_40->bits;
      pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
      if ((uVar15 & 4) != 0) goto LAB_00401d7f;
      *(uint *)&local_40->bits = uVar15 | 0xc;
      bVar9 = 4;
    }
    goto LAB_00401d95;
  }
  local_34 = 0;
  bVar9 = 0;
  if ((bailOutKind & BailOutForDebuggerBits) != BailOutInvalid) goto switchD_004022f9_caseD_c;
  bVar9 = 0;
  local_34 = 0;
  uVar29 = (undefined7)((ulong)local_40 >> 8);
  if (0x1fff < (int)bailOutKind) {
    if ((int)bailOutKind < 0x10000) {
      if (bailOutKind == BailOutOnPowIntIntOverflow) {
        bVar9 = (local_40->bits).field_0x4;
        pDVar28 = (DynamicProfileInfo *)CONCAT71(uVar29,bVar9);
        if ((bVar9 & 2) != 0) goto LAB_00401d7f;
        (local_40->bits).field_0x4 = bVar9 | 2;
        bVar9 = 0x29;
      }
      else if (bailOutKind == BailOutOnMissingValue) {
        uVar15 = *(uint *)&local_40->bits;
        pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
        if ((uVar15 >> 0xd & 1) != 0) goto LAB_00401d7f;
        *(uint *)&local_40->bits = uVar15 | 0x6000;
        bVar9 = 0x15;
      }
      else {
        if (bailOutKind != BailOutConventionalNativeArrayAccessOnly) goto switchD_004022f9_caseD_c;
        bVar9 = 0x1c;
      }
    }
    else if ((int)bailOutKind < 0x40000) {
      if (bailOutKind == BailOutConvertedNativeArray) {
        bVar9 = 0x18;
      }
      else {
        if (bailOutKind != BailOutOnArrayAccessHelperCall) goto switchD_004022f9_caseD_c;
        bVar9 = 0x19;
      }
    }
    else if (bailOutKind == BailOutOnInvalidatedArrayHeadSegment) {
      uVar15 = *(uint *)&local_40->bits;
      pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
      if ((short)uVar15 < 0) goto LAB_00401d7f;
      *(uint *)&local_40->bits = uVar15 | 0x18000;
      bVar9 = 0x1a;
    }
    else {
      if (bailOutKind != BailOnStackArgsOutOfActualsRange) goto switchD_004022f9_caseD_c;
      bVar9 = (local_40->bits).field_0x4;
      pDVar28 = (DynamicProfileInfo *)CONCAT71(uVar29,bVar9);
      if ((bVar9 & 8) != 0) goto LAB_00401d7f;
      (local_40->bits).field_0x4 = bVar9 | 8;
      bVar9 = 0x2a;
    }
    goto LAB_00401d95;
  }
  pDVar28 = local_40;
  switch(bailOutKind) {
  case BailOutNumberOnly:
  case BailOutPrimitiveButString:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 9 & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x200;
    bVar9 = 7;
    break;
  case BailOutOnImplicitCalls:
  case BailOutOnImplicitCallsPreOp:
    IVar11 = Js::FunctionBody::GetSavedImplicitCallsFlags(pFStack_48);
    if ((IVar11 & savedImplicitCallFlags) == ImplicitCall_None) {
      Js::DynamicProfileInfo::RecordImplicitCallFlags(local_40,savedImplicitCallFlags);
      puVar1 = &(local_40->bits).field_0x4;
      *puVar1 = *puVar1 | 4;
      bVar9 = 8;
LAB_00402613:
      local_34 = 0;
    }
    else {
      local_34 = (undefined4)CONCAT71(extraout_var,1);
      bVar9 = 0;
    }
    goto switchD_004022f9_caseD_c;
  case BailOutOnNotPrimitive:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 & 0x40) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x40;
    bVar9 = 0xc;
    break;
  case BailOutOnMemOpError:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((char)uVar15 < '\0') goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x80;
    bVar9 = 0xd;
    break;
  case BailOutOnInlineFunction:
  case BailOutOnPolymorphicInlineFunction:
  case BailOutFailedInlineTypeCheck:
    if (innerMostInlinee != (ScriptFunction *)0x0) {
      bVar9 = 10;
      break;
    }
    BVar12 = Js::FunctionBody::GetSavedInlinerVersion(pFStack_48);
    bVar8 = BVar12 == local_40->currentInlinerVersion;
    local_34 = (undefined4)CONCAT71(extraout_var_00,bVar8);
    bVar9 = 10;
    if (bVar8) {
      bVar9 = 0;
    }
    goto switchD_004022f9_caseD_c;
  case BailOutOnNoProfile:
    if (((local_40->bits).field_0x3 & 0x20) != 0) goto LAB_00401d7f;
    bVar9 = pFStack_48->bailOnMisingProfileRejitCount + 1;
    pFStack_48->bailOnMisingProfileRejitCount = bVar9;
    if (DAT_015aa2fc < bVar9) {
      puVar1 = &(local_40->bits).field_0x3;
      *puVar1 = *puVar1 | 0x20;
      bVar9 = 0x28;
      goto LAB_00402613;
    }
    pFStack_48->bailOnMisingProfileCount = '\0';
    bVar9 = 0x28;
    break;
  case BailOutOnFailedPolymorphicInlineTypeCheck:
    bVar9 = 9;
    break;
  default:
    goto switchD_004022f9_caseD_c;
  case BailOutOnNotArray:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 0xb & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x1800;
    bVar9 = 0x14;
    break;
  case BailOutOnNotNativeArray:
    bVar8 = 0x31 < local_40->rejitCount;
    local_34 = (undefined4)CONCAT71(uVar29,bVar8);
    bVar9 = 0x17;
    if (bVar8) {
      bVar9 = 0;
    }
    goto switchD_004022f9_caseD_c;
  case BailOutConventionalTypedArrayAccessOnly:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 0x13 & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x180000;
    bVar9 = 0x1b;
    break;
  case BailOutOnIrregularLength:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 0x15 & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x200000;
    bVar9 = 0x1d;
    break;
  case BailOutCheckThis:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 10 & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x400;
    bVar9 = 0xb;
    break;
  case BailOutOnTaggedValue:
    bVar9 = (local_40->bits).field_0x4;
    pDVar28 = (DynamicProfileInfo *)CONCAT71(uVar29,bVar9);
    if ((bVar9 & 0x10) != 0) goto LAB_00401d7f;
    (local_40->bits).field_0x4 = bVar9 | 0x10;
    bVar9 = 0x1e;
    break;
  case BailOutFailedTypeCheck:
  case BailOutFailedFixedFieldTypeCheck:
    if (innerMostInlinee != (ScriptFunction *)0x0) {
      bVar9 = bailOutKind == BailOutFailedTypeCheck ^ 0xf;
      break;
    }
    uVar15 = local_40->polymorphicCacheState;
    uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFStack_48);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFStack_48);
    bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ObjTypeSpecPhase,uVar13,functionId);
    if (bVar8) {
      pcVar27 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)pFStack_48,(wchar (*) [42])local_d8);
      uVar16 = Js::FunctionBody::GetSavedPolymorphicCacheState(pFStack_48);
      Output::Print(L"Objtypespec (%s): States on bailout: Saved cache: %d, Live cache: %d\n",
                    pcVar27,(ulong)uVar16,(ulong)uVar15);
      Output::Flush();
    }
    uVar16 = Js::FunctionBody::GetSavedPolymorphicCacheState(pFStack_48);
    bVar9 = bailOutKind == BailOutFailedTypeCheck ^ 0xf;
    local_34 = CONCAT31((int3)(uVar16 >> 8),uVar15 <= uVar16);
    if (uVar15 <= uVar16) {
      bVar9 = 0;
    }
    goto switchD_004022f9_caseD_c;
  case BailOutFailedEquivalentTypeCheck:
  case BailOutFailedEquivalentFixedFieldTypeCheck:
    if (*(int *)&local_40->bits < 0) goto LAB_00401d7f;
    bVar9 = 0x12 - (bailOutKind == BailOutFailedEquivalentTypeCheck);
    break;
  case BailOutExpectingInteger:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 0x1e & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x40000000;
    bVar9 = 0x22;
    break;
  case BailOutExpectingString:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 0x1e & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x40000000;
    bVar9 = 0x23;
    break;
  case BailOutFailedFixedFieldCheck:
    bVar9 = 0x10;
    break;
  case BailOutOnFloor:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 0x1c & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x10000000;
    bVar9 = 0x26;
    break;
  case BailOnModByPowerOf2:
    bVar9 = 0x27;
    break;
  case BailOutFailedCtorGuardCheck:
    bVar9 = 0x13;
    break;
  case BailOutOnFailedHoistedBoundCheck:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 0x16 & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0xc00000;
    bVar9 = 0x1f;
    break;
  case BailOutOnFailedHoistedLoopCountBasedBoundCheck:
    uVar15 = *(uint *)&local_40->bits;
    pDVar28 = (DynamicProfileInfo *)(ulong)uVar15;
    if ((uVar15 >> 0x18 & 1) != 0) goto LAB_00401d7f;
    *(uint *)&local_40->bits = uVar15 | 0x3000000;
    bVar9 = 0x20;
    break;
  case BailOutOnEarlyExit:
    bVar9 = (local_40->bits).field_0x4;
    pDVar28 = (DynamicProfileInfo *)CONCAT71(uVar29,bVar9);
    if ((bVar9 & 0x20) != 0) goto LAB_00401d7f;
    (local_40->bits).field_0x4 = bVar9 | 0x20;
    bVar9 = 0x2c;
  }
LAB_00401d95:
  local_34 = 0;
switchD_004022f9_caseD_c:
  if ((bVar9 != 0) && ((char)local_34 != '\0')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar18 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x915,"(!(rejitReason != RejitReason::None && reThunk))",
                       "!(rejitReason != RejitReason::None && reThunk)");
    if (!bVar8) goto LAB_00402859;
    *puVar18 = 0;
  }
LAB_00401dff:
  uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFStack_48);
  if ((pFStack_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar18 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar8) goto LAB_00402859;
    *puVar18 = 0;
  }
  bVar8 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015b0240,ReJITPhase,uVar13,
                     ((pFStack_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
                     )->functionId);
  uVar30 = (ulong)bVar9;
  uVar33 = 1;
  if (!bVar8) {
    uVar33 = uVar30;
  }
  if (bVar9 != 0) {
    uVar33 = uVar30;
  }
  reason = (RejitReason)uVar33;
  if (reason != None && (char)local_34 == '\0') {
    if ((99 < local_40->rejitCount) ||
       ((uVar30 = (ulong)local_68, local_40->bailOutOffsetForLastRejit == local_68 &&
        (bVar8 = Js::ScriptFunction::IsNewEntryPointAvailable(local_60), bVar8)))) {
      pSVar24 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFStack_48);
      if (pSVar24->rejitReasonCountsCap == (uint *)0x0) {
        local_34 = 1;
      }
      else {
        local_34 = (undefined4)CONCAT71((int7)(uVar30 >> 8),1);
        puVar2 = pSVar24->rejitReasonCountsCap + uVar33;
        *puVar2 = *puVar2 + 1;
      }
      reason = None;
    }
    else {
      local_40->rejitCount = local_40->rejitCount + 1;
      local_40->bailOutOffsetForLastRejit = local_68;
    }
  }
  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,ReJITPhase);
  if ((bVar8) &&
     ((DAT_015d63c0 == DAT_015d63c8 ||
      (bVar8 = Js::NumberSet::Contains((NumberSet *)&DAT_015d63a0,bailOutKind), bVar8)))) {
    pFVar17 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_60);
    iVar14 = (*(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar17);
    pcVar25 = GetBailOutKindName(bailOutKind);
    uVar3 = local_58->bailOutCount;
    pcVar26 = GetRejitReasonName(reason);
    pcVar31 = L"false";
    if ((char)local_34 != '\0') {
      pcVar31 = L"true";
    }
    Output::Print(L"Bailout from function: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d, reJitReason: %S, reThunk: %s\r\n"
                  ,CONCAT44(extraout_var_01,iVar14),pcVar25,(ulong)uVar3,(ulong)local_64,pcVar26,
                  pcVar31);
    Output::Flush();
  }
  pSVar24 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFStack_48);
  Js::ScriptContext::LogBailout(pSVar24,pFStack_48,bailOutKind);
  pFVar17 = pFStack_48;
  bVar9 = (byte)local_34;
  if (500 < local_58->bailOutCount) {
    pSVar24 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFStack_48);
    this = pSVar24->bailoutReasonCountsCap;
    if (this != (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) {
      local_d8[0] = bailOutKind;
      bVar8 = JsUtil::
              BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this,local_d8);
      if (bVar8) {
        local_6c = bailOutKind;
        uVar15 = JsUtil::
                 BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::Item(this,&local_6c);
        local_d8[0] = uVar15 + BailOutIntOnly;
        local_6c = bailOutKind;
        JsUtil::
        BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this,&local_6c,local_d8);
      }
      else {
        local_6c = BailOutIntOnly;
        local_d8[0] = bailOutKind;
        JsUtil::
        BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                  ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this,local_d8,&local_6c);
      }
    }
  }
  if (bVar9 != 0) {
    bVar8 = (pFVar17->field_0x179 & 8) == 0;
    RVar7 = AfterLoopBodyRejit;
    if (bVar8) {
      RVar7 = reason;
    }
    reason = RVar7;
    bVar9 = bVar8 & bVar9;
  }
  if (bVar9 == 0) {
    if (reason != None) {
      if ((local_58->type == SharedForLoopTop) &&
         (bVar8 = IR::IsTypeCheckBailOutKind(local_58->bailOutKind), pFVar17 = pFStack_48, bVar8)) {
        puVar1 = &(local_40->bits).field_0x4;
        *puVar1 = *puVar1 | 0x40;
      }
      pSVar24 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar17);
      Js::ScriptContext::LogRejit(pSVar24,pFStack_48,reason);
      pFStack_48->field_0x179 = pFStack_48->field_0x179 & 0xf7;
      pSVar24 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFStack_48);
      GenerateFunction(pSVar24->nativeCodeGen,pFStack_48,local_60);
      EVar10 = Js::FunctionBody::GetExecutionMode(pFStack_48);
      if (EVar10 != FullJit) {
        Js::FunctionBody::TraceExecutionMode(pFStack_48,"Rejit (before)");
        Js::FunctionBody::TransitionToFullJitExecutionMode(pFStack_48);
        Js::FunctionBody::TraceExecutionMode(pFStack_48,"Rejit");
      }
      uVar13 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFStack_48);
      if ((pFStack_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar18 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar8) {
LAB_00402859:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar18 = 0;
      }
      bVar8 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,ReJITPhase,uVar13,
                         ((pFStack_48->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo
                         .ptr)->functionId);
      pFVar17 = pFStack_48;
      if (bVar8) {
        iVar14 = (*(pFStack_48->super_ParseableFunctionInfo).super_FunctionProxy.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [7])(pFStack_48);
        pcVar27 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)pFVar17,(wchar (*) [42])local_d8);
        Output::Print(L"Rejit: function: %s (%s), bailOutCount: %hu",
                      CONCAT44(extraout_var_02,iVar14),pcVar27,(ulong)local_58->bailOutCount);
        Output::Print(L" callCount: %u",(ulong)local_49);
        pcVar25 = GetRejitReasonName(reason);
        Output::Print(L" reason: %S",pcVar25);
        if (bailOutKind != BailOutInvalid) {
          pcVar25 = GetBailOutKindName(bailOutKind);
          Output::Print(L" (%S)",pcVar25);
        }
        Output::Print(L"\n");
        Output::Flush();
      }
    }
  }
  else {
    pFVar20 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(pFVar17);
    entryPoint = Js::FunctionProxy::GetDirectEntryPoint
                           ((FunctionProxy *)pFVar17,(ProxyEntryPointInfo *)pFVar20);
    Js::ScriptFunction::UpdateThunkEntryPoint(local_60,pFVar20,entryPoint);
  }
  pSVar19->firstInterpreterFrameReturnAddress = (void *)0x0;
  return;
}

Assistant:

void BailOutRecord::ScheduleFunctionCodeGen(Js::ScriptFunction * function, Js::ScriptFunction * innerMostInlinee,
    BailOutRecord const * bailOutRecord, IR::BailOutKind bailOutKind, uint32 actualBailOutOffset, Js::ImplicitCallFlags savedImplicitCallFlags, void * returnAddress)
{
    if (bailOutKind == IR::BailOnSimpleJitToFullJitLoopBody ||
        bailOutKind == IR::BailOutForGeneratorYield ||
        bailOutKind == IR::LazyBailOut)
    {
        return;
    }

    Js::FunctionBody * executeFunction = function->GetFunctionBody();

    if (PHASE_OFF(Js::ReJITPhase, executeFunction))
    {
        return;
    }

    Js::AutoPushReturnAddressForStackWalker saveReturnAddress(executeFunction->GetScriptContext(), returnAddress);

    BailOutRecord * bailOutRecordNotConst = (BailOutRecord *)(void *)bailOutRecord;
    bailOutRecordNotConst->bailOutCount++;

    Js::FunctionEntryPointInfo *entryPointInfo = bailOutRecord->GetFunctionEntryPointInfo();

#if DBG
    // BailOutRecord is not recycler-allocated, so make sure something the recycler can see was keeping the entry point info alive.
    // We expect the entry point to be kept alive as follows:
    // 1. The function's current type might still have the same entry point info as when we entered the function (easy case)
    // 2. The function might have moved to a successor path type, which still keeps the previous type and its entry point info alive
    // 3. The entry point info might be held by the ThreadContext (QueueFreeOldEntryPointInfoIfInScript):
    //   a. If the entry point info was replaced on the type that used to hold it (ScriptFunction::ChangeEntryPoint)
    //   b. If the function's last-added property was deleted and it moved to a previous type (ScriptFunction::ReplaceTypeWithPredecessorType)
    //   c. If the function's path type got replaced with a dictionary, then all previous entry point infos in that path are queued on the ThreadContext (ScriptFunction::PrepareForConversionToNonPathType)
    bool foundEntryPoint = false;
    executeFunction->MapEntryPointsUntil([&](int index, Js::FunctionEntryPointInfo* info)
    {
        foundEntryPoint = info == entryPointInfo;
        return foundEntryPoint;
    });
    foundEntryPoint = foundEntryPoint || function->GetScriptContext()->GetThreadContext()->IsOldEntryPointInfo(entryPointInfo);
    Assert(foundEntryPoint);
#endif

    uint8 callsCount = entryPointInfo->callsCount > 255 ? 255 : static_cast<uint8>(entryPointInfo->callsCount);
    RejitReason rejitReason = RejitReason::None;
    bool reThunk = false;

    callsCount = callsCount <= Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() ? 0 : callsCount - Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() ;

    CheckPreemptiveRejit(executeFunction, bailOutKind, bailOutRecordNotConst, callsCount, -1);

    entryPointInfo->callsCount = callsCount;

    Assert(bailOutKind != IR::BailOutInvalid);

    Js::DynamicProfileInfo * profileInfo = executeFunction->HasDynamicProfileInfo() ? executeFunction->GetAnyDynamicProfileInfo() : nullptr;
    if ((profileInfo && callsCount == 0) ||
        PHASE_FORCE(Js::ReJITPhase, executeFunction))
    {
        if ((bailOutKind & (IR::BailOutOnResultConditions | IR::BailOutOnDivSrcConditions)) || bailOutKind == IR::BailOutIntOnly || bailOutKind == IR::BailOnIntMin || bailOutKind == IR::BailOnDivResultNotInt)
        {
            // Note WRT BailOnIntMin: it wouldn't make sense to re-jit without changing anything here, as interpreter will not change the (int) type,
            // so the options are: (1) rejit with disabling int type spec, (2) don't rejit, always bailout.
            // It seems to be better to rejit.
            if (bailOutKind & IR::BailOutOnMulOverflow)
            {
                if (profileInfo->IsAggressiveMulIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableAggressiveMulIntTypeSpec(false);
                    rejitReason = RejitReason::AggressiveMulIntTypeSpecDisabled;
                }
            }
            else if ((bailOutKind & (IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)) || bailOutKind == IR::BailOnDivResultNotInt)
            {
                if (profileInfo->IsDivIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableDivIntTypeSpec(false);
                    rejitReason = RejitReason::DivIntTypeSpecDisabled;
                }
            }
            else
            {
                if (profileInfo->IsAggressiveIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableAggressiveIntTypeSpec(false);
                    rejitReason = RejitReason::AggressiveIntTypeSpecDisabled;
                }
            }
        }
        else if (bailOutKind & IR::BailOutForDebuggerBits)
        {
            // Do not rejit, do not rethunk, just ignore the bailout.
        }
        else switch(bailOutKind)
        {
            case IR::BailOutOnNotPrimitive:
                if (profileInfo->IsLossyIntTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLossyIntTypeSpec();
                    rejitReason = RejitReason::LossyIntTypeSpecDisabled;
                }
                break;
            case IR::BailOutOnMemOpError:
                if (profileInfo->IsMemOpDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableMemOp();
                    rejitReason = RejitReason::MemOpDisabled;
                }
                break;

            case IR::BailOutPrimitiveButString:
            case IR::BailOutNumberOnly:
                if (profileInfo->IsFloatTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableFloatTypeSpec();
                    rejitReason = RejitReason::FloatTypeSpecDisabled;
                }
                break;

            case IR::BailOutOnImplicitCalls:
            case IR::BailOutOnImplicitCallsPreOp:
                // Check if the implicit call flags in the profile have changed since we last JITed this
                // function body. If so, and they indicate an implicit call of some sort occurred
                // then we need to reJIT.
                if ((executeFunction->GetSavedImplicitCallsFlags() & savedImplicitCallFlags) == Js::ImplicitCall_None)
                {
                    profileInfo->RecordImplicitCallFlags(savedImplicitCallFlags);
                    profileInfo->DisableLoopImplicitCallInfo();
                    rejitReason = RejitReason::ImplicitCallFlagsChanged;
                }
                else
                {
                    reThunk = true;
                }
                break;

            case IR::BailOnModByPowerOf2:
                rejitReason = RejitReason::ModByPowerOf2;
                break;

            case IR::BailOutOnNotArray:
                if(profileInfo->IsArrayCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableArrayCheckHoist(false);
                    rejitReason = RejitReason::ArrayCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnNotNativeArray:

                // REVIEW: We have an issue with array profile info.  The info on the type of array we have won't
                //         get fixed by rejitting.  For now, just give up after 50 rejits.
                if (profileInfo->GetRejitCount() >= 50)
                {
                    reThunk = true;
                }
                else
                {
                    rejitReason = RejitReason::ExpectingNativeArray;
                }
                break;

            case IR::BailOutConvertedNativeArray:
                rejitReason = RejitReason::ConvertedNativeArray;
                break;

            case IR::BailOutConventionalTypedArrayAccessOnly:
                if(profileInfo->IsTypedArrayTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableTypedArrayTypeSpec(false);
                    rejitReason = RejitReason::TypedArrayTypeSpecDisabled;
                }
                break;

            case IR::BailOutConventionalNativeArrayAccessOnly:
                rejitReason = RejitReason::ExpectingConventionalNativeArrayAccess;
                break;

            case IR::BailOutOnMissingValue:
                if(profileInfo->IsArrayMissingValueCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableArrayMissingValueCheckHoist(false);
                    rejitReason = RejitReason::ArrayMissingValueCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnArrayAccessHelperCall:
                // This is a pre-op bailout, so the interpreter will update the profile data for this byte-code instruction to
                // prevent excessive bailouts here in the future
                rejitReason = RejitReason::ArrayAccessNeededHelperCall;
                break;

            case IR::BailOutOnInvalidatedArrayHeadSegment:
                if(profileInfo->IsJsArraySegmentHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableJsArraySegmentHoist(false);
                    rejitReason = RejitReason::JsArraySegmentHoistDisabled;
                }
                break;

            case IR::BailOutOnIrregularLength:
                if(profileInfo->IsLdLenIntSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLdLenIntSpec();
                    rejitReason = RejitReason::LdLenIntSpecDisabled;
                }
                break;

            case IR::BailOutOnFailedHoistedBoundCheck:
                if(profileInfo->IsBoundCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableBoundCheckHoist(false);
                    rejitReason = RejitReason::BoundCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
                if(profileInfo->IsLoopCountBasedBoundCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLoopCountBasedBoundCheckHoist(false);
                    rejitReason = RejitReason::LoopCountBasedBoundCheckHoistDisabled;
                }
                break;

            case IR::BailOutExpectingInteger:
                if (profileInfo->IsSwitchOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableSwitchOpt();
                    rejitReason = RejitReason::DisableSwitchOptExpectingInteger;
                }
                break;

            case IR::BailOutExpectingString:
                if (profileInfo->IsSwitchOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableSwitchOpt();
                    rejitReason = RejitReason::DisableSwitchOptExpectingString;
                }
                break;

            case IR::BailOutOnFailedPolymorphicInlineTypeCheck:
                rejitReason = RejitReason::FailedPolymorphicInlineeTypeCheck;
                break;

            case IR::BailOnStackArgsOutOfActualsRange:
                if (profileInfo->IsStackArgOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableStackArgOpt();
                    rejitReason = RejitReason::DisableStackArgOpt;
                }
                break;
            case IR::BailOutOnPolymorphicInlineFunction:
            case IR::BailOutFailedInlineTypeCheck:
            case IR::BailOutOnInlineFunction:
                // Check if the inliner state has changed since we last JITed this function body. If so
                // then we need to reJIT.
                if (innerMostInlinee)
                {
                    // There is no way now to check if the inlinee version has changed. Just rejit.
                    // This should be changed to getting the inliner version corresponding to inlinee.
                    rejitReason = RejitReason::InlineeChanged;
                }
                else
                {
                    if (executeFunction->GetSavedInlinerVersion() == profileInfo->GetInlinerVersion())
                    {
                        reThunk = true;
                    }
                    else
                    {
                        rejitReason = RejitReason::InlineeChanged;
                    }
                }
                break;

            case IR::BailOutOnNoProfile:
                if (profileInfo->IsNoProfileBailoutsDisabled())
                {
                    reThunk = true;
                }
                else if (executeFunction->IncrementBailOnMisingProfileRejitCount() >  (uint)CONFIG_FLAG(BailOnNoProfileRejitLimit))
                {
                    profileInfo->DisableNoProfileBailouts();
                    rejitReason = RejitReason::NoProfile;
                }
                else
                {
                    executeFunction->ResetBailOnMisingProfileCount();
                    rejitReason = RejitReason::NoProfile;
                }
                break;

            case IR::BailOutCheckThis:
                // Presumably we've started passing a different "this" pointer to callees.
                if (profileInfo->IsCheckThisDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableCheckThis();
                    rejitReason = RejitReason::CheckThisDisabled;
                }
                break;

            case IR::BailOutOnTaggedValue:
                if (profileInfo->IsTagCheckDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableTagCheck();
                    rejitReason = RejitReason::FailedTagCheck;
                }
                break;

            case IR::BailOutFailedTypeCheck:
            case IR::BailOutFailedFixedFieldTypeCheck:
            {
                // An inline cache must have gone from monomorphic to polymorphic.
                // This is already noted in the profile data, so optimization of the given ld/st will
                // be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.
                if (innerMostInlinee)
                {
                    rejitReason = bailOutKind == IR::BailOutFailedTypeCheck ? RejitReason::FailedTypeCheck : RejitReason::FailedFixedFieldTypeCheck;
                }
                else
                {
                    uint32 state;
                    state = profileInfo->GetPolymorphicCacheState();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                    if (PHASE_TRACE(Js::ObjTypeSpecPhase, executeFunction))
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        Output::Print(
                            _u("Objtypespec (%s): States on bailout: Saved cache: %d, Live cache: %d\n"),
                            executeFunction->GetDebugNumberSet(debugStringBuffer), executeFunction->GetSavedPolymorphicCacheState(), state);
                        Output::Flush();
                    }
#endif
                    if (state <= executeFunction->GetSavedPolymorphicCacheState())
                    {
                        reThunk = true;
                    }
                    else
                    {
                        rejitReason = bailOutKind == IR::BailOutFailedTypeCheck ?
                            RejitReason::FailedTypeCheck : RejitReason::FailedFixedFieldTypeCheck;
                    }
                }
                break;
            }

            case IR::BailOutFailedEquivalentTypeCheck:
            case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
                if (profileInfo->IsEquivalentObjTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    rejitReason = bailOutKind == IR::BailOutFailedEquivalentTypeCheck ?
                        RejitReason::FailedEquivalentTypeCheck : RejitReason::FailedEquivalentFixedFieldTypeCheck;
                }
                break;

            case IR::BailOutFailedFixedFieldCheck:
                rejitReason = RejitReason::FailedFixedFieldCheck;
                break;

            case IR::BailOutFailedCtorGuardCheck:
                // (ObjTypeSpec): Consider scheduling re-JIT right after the first bailout.  We will never successfully execute the
                // function from which we just bailed out, unless we take a different code path through it.

                // A constructor cache guard may be invalidated for one of two reasons:
                // a) the constructor's prototype property has changed, or
                // b) one of the properties protected by the guard (this constructor cache served as) has changed in some way (e.g. became read-only).
                // In the former case, the cache itself will be marked as polymorphic and on re-JIT we won't do the optimization.
                // In the latter case, the inline cache for the offending property will be cleared and on re-JIT the guard will not be enlisted
                // to protect that property operation.
                rejitReason = RejitReason::CtorGuardInvalidated;
                break;

            case IR::BailOutOnFloor:
            {
                if (profileInfo->IsFloorInliningDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableFloorInlining();
                    rejitReason = RejitReason::FloorInliningDisabled;
                }
                break;
            }
            case IR::BailOutOnPowIntIntOverflow:
            {
                if (profileInfo->IsPowIntIntTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisablePowIntIntTypeSpec();
                    rejitReason = RejitReason::PowIntIntTypeSpecDisabled;
                }
                break;
            }
            case IR::BailOutOnEarlyExit:
            {
                if (profileInfo->IsOptimizeTryFinallyDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableOptimizeTryFinally();
                    rejitReason = RejitReason::OptimizeTryFinallyDisabled;
                }
                break;
            }
        }

        Assert(!(rejitReason != RejitReason::None && reThunk));
    }

    if(PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
    {
        rejitReason = RejitReason::Forced;
    }

    if (!reThunk && rejitReason != RejitReason::None)
    {
        // REVIEW: Temporary fix for RS1.  Disable Rejiting if it looks like it is not fixing the problem.
        //         For RS2, turn the rejitCount check into an assert and let's fix all these issues.
        if (profileInfo->GetRejitCount() >= 100 ||
            (profileInfo->GetBailOutOffsetForLastRejit() == actualBailOutOffset && function->IsNewEntryPointAvailable()))
        {
#ifdef REJIT_STATS
            Js::ScriptContext* scriptContext = executeFunction->GetScriptContext();
            if (scriptContext->rejitReasonCountsCap != nullptr)
            {
                scriptContext->rejitReasonCountsCap[static_cast<byte>(rejitReason)]++;
            }
#endif
            reThunk = true;
            rejitReason = RejitReason::None;
        }
        else
        {
            profileInfo->IncRejitCount();
            profileInfo->SetBailOutOffsetForLastRejit(actualBailOutOffset);
        }
    }

    REJIT_KIND_TESTTRACE(bailOutKind, _u("Bailout from function: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d, reJitReason: %S, reThunk: %s\r\n"),
        function->GetFunctionBody()->GetDisplayName(), ::GetBailOutKindName(bailOutKind), bailOutRecord->bailOutCount, callsCount,
        GetRejitReasonName(rejitReason), reThunk ? trueString : falseString);

    JS_ETW(EventWriteJSCRIPT_BACKEND_BAILOUT(function->GetFunctionBody()->GetLocalFunctionId(),
        function->GetFunctionBody()->GetSourceContextId(), function->GetFunctionBody()->GetDisplayName(), bailOutKind, bailOutRecord->bailOutCount, callsCount,
        GetRejitReasonName(rejitReason), reThunk));

#ifdef REJIT_STATS
    executeFunction->GetScriptContext()->LogBailout(executeFunction, bailOutKind);
    if (bailOutRecord->bailOutCount > 500)
    {
        Js::ScriptContext* scriptContext = executeFunction->GetScriptContext();
        auto bailoutReasonCountsCap = scriptContext->bailoutReasonCountsCap;
        if (bailoutReasonCountsCap != nullptr)
        {
            if (!bailoutReasonCountsCap->ContainsKey(bailOutKind))
            {
                bailoutReasonCountsCap->Item(bailOutKind, 1);
            }
            else
            {
                uint val = bailoutReasonCountsCap->Item(bailOutKind);
                ++val;
                bailoutReasonCountsCap->Item(bailOutKind, val);
            }
        }
    }
#endif

    if (reThunk && executeFunction->DontRethunkAfterBailout())
    {
        // This function is marked for rethunking, but the last ReJIT we've done was for a JIT loop body
        // So the latest rejitted version of this function may not have the right optimization disabled.
        // Rejit just to be safe.
        reThunk = false;
        rejitReason = RejitReason::AfterLoopBodyRejit;
    }
    if (reThunk)
    {
        Js::FunctionEntryPointInfo *const defaultEntryPointInfo = executeFunction->GetDefaultFunctionEntryPointInfo();
        function->UpdateThunkEntryPoint(defaultEntryPointInfo, executeFunction->GetDirectEntryPoint(defaultEntryPointInfo));
    }
    else if (rejitReason != RejitReason::None)
    {
        if (bailOutRecord->IsForLoopTop() && IR::IsTypeCheckBailOutKind(bailOutRecord->bailOutKind))
        {
            // Disable FieldPRE if we're triggering a type check rejit due to a bailout at the loop top.
            // Most likely this was caused by a CheckFixedFld that was hoisted from a branch block where
            // only certain types flowed, to the loop top, where more types (different or non-equivalent)
            // were flowing in.
            profileInfo->DisableFieldPRE();
        }
#ifdef REJIT_STATS
        executeFunction->GetScriptContext()->LogRejit(executeFunction, rejitReason);
#endif
        executeFunction->ClearDontRethunkAfterBailout();

        GenerateFunction(executeFunction->GetScriptContext()->GetNativeCodeGenerator(), executeFunction, function);

        if(executeFunction->GetExecutionMode() != ExecutionMode::FullJit)
        {
            // With expiry, it's possible that the execution mode is currently interpreter or simple JIT. Transition to full JIT
            // after successfully scheduling the rejit work item (in case of OOM).
            executeFunction->TraceExecutionMode("Rejit (before)");
            executeFunction->TransitionToFullJitExecutionMode();
            executeFunction->TraceExecutionMode("Rejit");
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(PHASE_TRACE(Js::ReJITPhase, executeFunction))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(
                _u("Rejit: function: %s (%s), bailOutCount: %hu"),
                executeFunction->GetDisplayName(),
                executeFunction->GetDebugNumberSet(debugStringBuffer),
                bailOutRecord->bailOutCount);

            Output::Print(_u(" callCount: %u"), callsCount);
            Output::Print(_u(" reason: %S"), GetRejitReasonName(rejitReason));
            if(bailOutKind != IR::BailOutInvalid)
            {
                Output::Print(_u(" (%S)"), ::GetBailOutKindName(bailOutKind));
            }
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }
}